

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Vfs_getenv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  jx9_value *pjVar2;
  char *pcVar3;
  int iLen;
  int local_2c;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pvVar1 = pCtx->pFunc->pUserData;
    if ((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 0xf0) != 0)) {
      pcVar3 = jx9_value_to_string(*apArg,&local_2c);
      pjVar2 = pCtx->pRet;
      jx9MemObjRelease(pjVar2);
      (pjVar2->x).rVal = 0.0;
      pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
      if (local_2c < 1) {
        return 0;
      }
      (**(code **)((long)pvVar1 + 0xf0))(pcVar3,pCtx);
      return 0;
    }
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString);
  }
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  (pjVar2->x).rVal = 0.0;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Vfs_getenv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zEnv;
	jx9_vfs *pVfs;
	int iLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xGetenv == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the environment variable */
	zEnv = jx9_value_to_string(apArg[0], &iLen);
	/* Set a boolean FALSE as the default return value */
	jx9_result_bool(pCtx, 0);
	if( iLen < 1 ){
		/* Empty string */
		return JX9_OK;
	}
	/* Perform the requested operation */
	pVfs->xGetenv(zEnv, pCtx);
	return JX9_OK;
}